

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

function<void_(UdpSocket_*,_void_*)> * __thiscall
SslUdpSocketImpl::BindFuncSslInitDone
          (function<void_(UdpSocket_*,_void_*)> *__return_storage_ptr__,SslUdpSocketImpl *this,
          function<void_(UdpSocket_*,_void_*)> *fSllInitDone)

{
  std::function<void_(UdpSocket_*,_void_*)>::swap(&this->m_fSllInitDoneParam,fSllInitDone);
  std::function<void_(UdpSocket_*,_void_*)>::function(__return_storage_ptr__,fSllInitDone);
  return __return_storage_ptr__;
}

Assistant:

function<void(UdpSocket*, void*)> SslUdpSocketImpl::BindFuncSslInitDone(function<void(UdpSocket*, void*)> fSllInitDone) noexcept
{
    m_fSllInitDoneParam.swap(fSllInitDone);
    return fSllInitDone;
}